

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O2

void __thiscall
MemoryEditor::DrawOptionsLine
          (MemoryEditor *this,Sizes *s,void *mem_data,size_t mem_size,size_t base_display_addr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ImVec2 IVar3;
  bool bVar4;
  int iVar5;
  ImGuiStyle *pIVar6;
  ulong uVar7;
  char *fmt;
  float fVar8;
  float fVar9;
  size_t goto_addr;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  
  local_48 = mem_size;
  pIVar6 = ImGui::GetStyle();
  fmt = "Range %0*zx..%0*zx";
  if (this->OptUpperCaseHex != false) {
    fmt = "Range %0*zX..%0*zX";
  }
  goto_addr = 0;
  bVar4 = ImGui::Button("Options",(ImVec2 *)&goto_addr);
  if (bVar4) {
    ImGui::OpenPopup("context",0);
  }
  bVar4 = ImGui::BeginPopup("context",0);
  if (bVar4) {
    fVar8 = (pIVar6->FramePadding).x;
    ImGui::SetNextItemWidth(s->GlyphWidth * 7.0 + fVar8 + fVar8);
    bVar4 = ImGui::DragInt("##cols",&this->Cols,0.2,4,0x20,"%d cols",0);
    if ((bVar4) && (this->ContentsWidthChanged = true, this->Cols < 1)) {
      this->Cols = 1;
    }
    ImGui::Checkbox("Show Data Preview",&this->OptShowDataPreview);
    ImGui::Checkbox("Show HexII",&this->OptShowHexII);
    bVar4 = ImGui::Checkbox("Show Ascii",&this->OptShowAscii);
    if (bVar4) {
      this->ContentsWidthChanged = true;
    }
    ImGui::Checkbox("Grey out zeroes",&this->OptGreyOutZeroes);
    ImGui::Checkbox("Uppercase Hex",&this->OptUpperCaseHex);
    ImGui::EndPopup();
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text(fmt,(ulong)(uint)s->AddrDigitsCount,base_display_addr);
  ImGui::SameLine(0.0,-1.0);
  fVar8 = (pIVar6->FramePadding).x;
  ImGui::SetNextItemWidth((float)(s->AddrDigitsCount + 1) * s->GlyphWidth + fVar8 + fVar8);
  bVar4 = ImGui::InputText("##addr",this->AddrInputBuf,0x20,0x22,(ImGuiInputTextCallback)0x0,
                           (void *)0x0);
  if (bVar4) {
    iVar5 = __isoc99_sscanf(this->AddrInputBuf,"%zX",&goto_addr);
    if (iVar5 == 1) {
      this->GotoAddr = goto_addr - base_display_addr;
      *(undefined4 *)&this->HighlightMin = 0xffffffff;
      *(undefined4 *)((long)&this->HighlightMin + 4) = 0xffffffff;
      *(undefined4 *)&this->HighlightMax = 0xffffffff;
      *(undefined4 *)((long)&this->HighlightMax + 4) = 0xffffffff;
    }
  }
  if (this->GotoAddr != 0xffffffffffffffff) {
    if (this->GotoAddr < local_48) {
      goto_addr = 0;
      ImGui::BeginChild("##scrolling",(ImVec2 *)&goto_addr,false,0);
      IVar3 = ImGui::GetCursorStartPos();
      fStack_40 = IVar3.y;
      local_48 = CONCAT44(fStack_40,fStack_40);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)this->Cols;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->GotoAddr;
      uVar7 = SUB168(auVar2 / auVar1,0);
      if ((long)uVar7 < 0) {
        fVar8 = (float)((ulong)(SUB164(auVar2 / auVar1,0) & 1) | uVar7 >> 1);
        fVar8 = fVar8 + fVar8;
      }
      else {
        fVar8 = (float)(long)uVar7;
      }
      fStack_3c = fStack_40;
      fVar9 = ImGui::GetTextLineHeight();
      ImGui::SetScrollFromPosY(fVar9 * fVar8 + (float)local_48,0.5);
      ImGui::EndChild();
      this->DataPreviewAddr = this->GotoAddr;
      this->DataEditingAddr = this->GotoAddr;
      this->DataEditingTakeFocus = true;
    }
    this->GotoAddr = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void DrawOptionsLine(const Sizes& s, void* mem_data, size_t mem_size, size_t base_display_addr)
    {
        IM_UNUSED(mem_data);
        ImGuiStyle& style = ImGui::GetStyle();
        const char* format_range = OptUpperCaseHex ? "Range %0*" _PRISizeT "X..%0*" _PRISizeT "X" : "Range %0*" _PRISizeT "x..%0*" _PRISizeT "x";

        // Options menu
        if (ImGui::Button("Options"))
            ImGui::OpenPopup("context");
        if (ImGui::BeginPopup("context"))
        {
            ImGui::SetNextItemWidth(s.GlyphWidth * 7 + style.FramePadding.x * 2.0f);
            if (ImGui::DragInt("##cols", &Cols, 0.2f, 4, 32, "%d cols")) { ContentsWidthChanged = true; if (Cols < 1) Cols = 1; }
            ImGui::Checkbox("Show Data Preview", &OptShowDataPreview);
            ImGui::Checkbox("Show HexII", &OptShowHexII);
            if (ImGui::Checkbox("Show Ascii", &OptShowAscii)) { ContentsWidthChanged = true; }
            ImGui::Checkbox("Grey out zeroes", &OptGreyOutZeroes);
            ImGui::Checkbox("Uppercase Hex", &OptUpperCaseHex);

            ImGui::EndPopup();
        }

        ImGui::SameLine();
        ImGui::Text(format_range, s.AddrDigitsCount, base_display_addr, s.AddrDigitsCount, base_display_addr + mem_size - 1);
        ImGui::SameLine();
        ImGui::SetNextItemWidth((s.AddrDigitsCount + 1) * s.GlyphWidth + style.FramePadding.x * 2.0f);
        if (ImGui::InputText("##addr", AddrInputBuf, IM_ARRAYSIZE(AddrInputBuf), ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_EnterReturnsTrue))
        {
            size_t goto_addr;
            if (sscanf(AddrInputBuf, "%" _PRISizeT "X", &goto_addr) == 1)
            {
                GotoAddr = goto_addr - base_display_addr;
                HighlightMin = HighlightMax = (size_t)-1;
            }
        }

        if (GotoAddr != (size_t)-1)
        {
            if (GotoAddr < mem_size)
            {
                ImGui::BeginChild("##scrolling");
                ImGui::SetScrollFromPosY(ImGui::GetCursorStartPos().y + (GotoAddr / Cols) * ImGui::GetTextLineHeight());
                ImGui::EndChild();
                DataEditingAddr = DataPreviewAddr = GotoAddr;
                DataEditingTakeFocus = true;
            }
            GotoAddr = (size_t)-1;
        }
    }